

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int CMAC_Init(CMAC_CTX *ctx,void *key,size_t keylen,EVP_CIPHER *cipher,ENGINE *impl)

{
  int iVar1;
  uint inl;
  EVP_CIPHER *pEVar2;
  int bl;
  
  if ((((key == (void *)0x0) && (cipher == (EVP_CIPHER *)0x0)) && (impl == (ENGINE *)0x0)) &&
     (keylen == 0)) {
    if (*(int *)(ctx + 0x88) == -1) {
      return 0;
    }
    iVar1 = EVP_EncryptInit_ex(*(EVP_CIPHER_CTX **)ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,
                               "");
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_CIPHER_CTX_get_block_size((EVP_CIPHER_CTX *)0x3a79a3);
    memset(ctx + 0x48,0,(long)iVar1);
    *(undefined4 *)(ctx + 0x88) = 0;
    return 1;
  }
  if (cipher != (EVP_CIPHER *)0x0) {
    *(undefined4 *)(ctx + 0x88) = 0xffffffff;
    iVar1 = EVP_EncryptInit_ex(*(EVP_CIPHER_CTX **)ctx,cipher,impl,(uchar *)0x0,(uchar *)0x0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (key != (void *)0x0) {
    *(undefined4 *)(ctx + 0x88) = 0xffffffff;
    pEVar2 = EVP_CIPHER_CTX_get0_cipher(*(EVP_CIPHER_CTX **)ctx);
    if (pEVar2 == (EVP_CIPHER *)0x0) {
      return 0;
    }
    iVar1 = EVP_CIPHER_CTX_set_key_length(*(EVP_CIPHER_CTX **)ctx,(int)keylen);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = EVP_EncryptInit_ex(*(EVP_CIPHER_CTX **)ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)key,
                               "");
    if (iVar1 == 0) {
      return 0;
    }
    inl = EVP_CIPHER_CTX_get_block_size((EVP_CIPHER_CTX *)0x3a7ab8);
    if ((int)inl < 0) {
      return 0;
    }
    iVar1 = EVP_Cipher(*(EVP_CIPHER_CTX **)ctx,(uchar *)(ctx + 0x48),"",inl);
    if (iVar1 < 1) {
      return 0;
    }
    make_kn((uchar *)(ctx + 8),(uchar *)(ctx + 0x48),inl);
    make_kn((uchar *)(ctx + 0x28),(uchar *)(ctx + 8),inl);
    OPENSSL_cleanse(ctx + 0x48,(long)(int)inl);
    iVar1 = EVP_EncryptInit_ex(*(EVP_CIPHER_CTX **)ctx,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,
                               "");
    if (iVar1 == 0) {
      return 0;
    }
    memset(ctx + 0x48,0,(long)(int)inl);
    *(undefined4 *)(ctx + 0x88) = 0;
  }
  return 1;
}

Assistant:

int CMAC_Init(CMAC_CTX *ctx, const void *key, size_t keylen,
              const EVP_CIPHER *cipher, ENGINE *impl)
{
    static const unsigned char zero_iv[EVP_MAX_BLOCK_LENGTH] = { 0 };

    /* All zeros means restart */
    if (!key && !cipher && !impl && keylen == 0) {
        /* Not initialised */
        if (ctx->nlast_block == -1)
            return 0;
        if (!EVP_EncryptInit_ex(ctx->cctx, NULL, NULL, NULL, zero_iv))
            return 0;
        memset(ctx->tbl, 0, EVP_CIPHER_CTX_get_block_size(ctx->cctx));
        ctx->nlast_block = 0;
        return 1;
    }
    /* Initialise context */
    if (cipher != NULL) {
        /* Ensure we can't use this ctx until we also have a key */
        ctx->nlast_block = -1;
        if (!EVP_EncryptInit_ex(ctx->cctx, cipher, impl, NULL, NULL))
            return 0;
    }
    /* Non-NULL key means initialisation complete */
    if (key != NULL) {
        int bl;

        /* If anything fails then ensure we can't use this ctx */
        ctx->nlast_block = -1;
        if (!EVP_CIPHER_CTX_get0_cipher(ctx->cctx))
            return 0;
        if (!EVP_CIPHER_CTX_set_key_length(ctx->cctx, keylen))
            return 0;
        if (!EVP_EncryptInit_ex(ctx->cctx, NULL, NULL, key, zero_iv))
            return 0;
        if ((bl = EVP_CIPHER_CTX_get_block_size(ctx->cctx)) < 0)
            return 0;
        if (EVP_Cipher(ctx->cctx, ctx->tbl, zero_iv, bl) <= 0)
            return 0;
        make_kn(ctx->k1, ctx->tbl, bl);
        make_kn(ctx->k2, ctx->k1, bl);
        OPENSSL_cleanse(ctx->tbl, bl);
        /* Reset context again ready for first data block */
        if (!EVP_EncryptInit_ex(ctx->cctx, NULL, NULL, NULL, zero_iv))
            return 0;
        /* Zero tbl so resume works */
        memset(ctx->tbl, 0, bl);
        ctx->nlast_block = 0;
    }
    return 1;
}